

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropon.c
# Opt level: O0

void mj_free_component(mj_component_t *c)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  if (in_RDI != 0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x10); local_c = local_c + 1) {
      free(*(void **)(*(long *)(in_RDI + 0x18) + (long)local_c * 8));
    }
    free(*(void **)(in_RDI + 0x18));
  }
  return;
}

Assistant:

void mj_free_component(mj_component_t *c) {
    if(c == NULL) {
        return;
    }

    int i;

    for(i = 0; i < c->nblocks; i++) {
        free(c->blocks[i]);
    }

    free(c->blocks);

    return;
}